

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint h;
  long *iEnd;
  long *iStart;
  BYTE *pBVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  U32 h_00;
  U32 h_01;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  BYTE *pBVar7;
  long *mEnd;
  U32 *pUVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  uint uVar12;
  undefined8 uVar13;
  char cVar14;
  uint uVar15;
  size_t _pos_3;
  long *plVar16;
  long *plVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  seqDef *psVar22;
  byte bVar23;
  byte bVar24;
  long *plVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  long *plVar32;
  long *plVar33;
  uint uVar34;
  uint uVar35;
  int *piVar36;
  BYTE *pBVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  U32 UVar41;
  uint uVar42;
  U32 UVar43;
  int iVar44;
  BYTE *litEnd;
  long *plVar45;
  long *plVar46;
  uint local_124;
  BYTE *litLimit_w_1;
  BYTE *litLimit_w_3;
  char *_ptr;
  BYTE *litLimit_w;
  
  pBVar5 = (ms->window).base;
  iEnd = (long *)((long)src + srcSize);
  iVar29 = (int)pBVar5;
  uVar40 = (int)iEnd - iVar29;
  uVar42 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar3 = (ms->window).dictLimit;
  uVar12 = uVar40 - uVar42;
  if (uVar40 - uVar3 <= uVar42) {
    uVar12 = uVar3;
  }
  if (ms->loadedDictEnd != 0) {
    uVar12 = uVar3;
  }
  pZVar6 = ms->dictMatchState;
  uVar4 = (pZVar6->window).dictLimit;
  pBVar7 = (pZVar6->window).base;
  plVar25 = (long *)(pBVar7 + uVar4);
  iStart = (long *)(pBVar5 + uVar12);
  uVar42 = uVar42 + uVar3;
  plVar16 = (long *)((long)src + (srcSize - 8));
  mEnd = (long *)(pZVar6->window).nextSrc;
  uVar30 = ((int)pBVar7 - (int)mEnd) + uVar12;
  pUVar8 = pZVar6->hashTable;
  pUVar9 = pZVar6->chainTable;
  uVar35 = (pZVar6->cParams).hashLog;
  uVar39 = (pZVar6->cParams).chainLog;
  uVar34 = ((int)src - ((int)plVar25 + (int)iStart)) + (int)mEnd;
  uVar38 = (ms->cParams).minMatch;
  pUVar10 = ms->hashTable;
  h_00 = (ms->cParams).hashLog;
  pUVar11 = ms->chainTable;
  h_01 = (ms->cParams).chainLog;
  local_124 = *rep;
  uVar15 = rep[1];
  uVar3 = uVar35 + 8;
  h = uVar39 + 8;
  uVar31 = (ulong)uVar30;
  bVar24 = (byte)uVar35;
  bVar23 = (byte)uVar39;
  cVar14 = (char)h_01;
  if (uVar38 == 5) {
    if (uVar42 < uVar40) goto LAB_00185c37;
    if (ms->prefetchCDictTables != 0) {
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar24 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar23 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
    }
    if (uVar34 < local_124) goto LAB_00185c56;
    if (uVar15 <= uVar34) {
      plVar45 = (long *)((long)src + (ulong)(uVar34 == 0));
      bVar24 = 0x40 - cVar14;
      plVar17 = iEnd + -4;
LAB_00183b83:
      if (plVar45 < plVar16) {
        if ((((0x20 < h_00) || (sVar20 = ZSTD_hash8Ptr(plVar45,h_00), 0x20 < h_01)) ||
            (uVar26 = (ulong)(*plVar45 * -0x30e4432345000000) >> (bVar24 & 0x3f), 0x20 < uVar3)) ||
           (sVar21 = ZSTD_hash8Ptr(plVar45,uVar3), 0x20 < h)) goto LAB_00185b20;
        lVar28 = *plVar45;
        uVar27 = (ulong)(lVar28 * -0x30e4432345000000) >> (0x38 - bVar23 & 0x3f);
        uVar40 = pUVar8[sVar21 >> 8];
        uVar42 = pUVar9[uVar27 >> 8];
        iVar44 = (int)plVar45;
        UVar41 = iVar44 - iVar29;
        uVar35 = pUVar10[sVar20];
        uVar39 = pUVar11[uVar26];
        UVar43 = UVar41 + 1;
        pUVar11[uVar26] = UVar41;
        uVar38 = UVar43 - local_124;
        pUVar10[sVar20] = UVar41;
        if ((uVar12 - 1) - uVar38 < 3) {
LAB_00183cbd:
          if (uVar12 < uVar35) {
            plVar32 = (long *)(pBVar5 + uVar35);
            if (*plVar32 != lVar28) goto LAB_00183d5d;
            sVar20 = ZSTD_count((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd);
            uVar26 = sVar20 + 8;
            uVar39 = iVar44 - (int)plVar32;
            for (; ((iStart < plVar32 && (src < plVar45)) &&
                   (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                plVar45 = (long *)((long)plVar45 + -1)) {
              plVar32 = (long *)((long)plVar32 + -1);
              uVar26 = uVar26 + 1;
            }
            goto LAB_001841d6;
          }
          if ((char)sVar21 == (char)uVar40) {
            uVar40 = uVar40 >> 8;
            plVar32 = (long *)(pBVar7 + uVar40);
            if (mEnd <= plVar32) goto LAB_00185bda;
            if ((uVar4 < uVar40) && (*plVar32 == lVar28)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar26 = sVar20 + 8;
              uVar39 = UVar41 - (uVar40 + uVar30);
              for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                     (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                  plVar45 = (long *)((long)plVar45 + -1)) {
                plVar32 = (long *)((long)plVar32 + -1);
                uVar26 = uVar26 + 1;
              }
              goto LAB_001841d6;
            }
          }
LAB_00183d5d:
          if (uVar12 < uVar39) {
            plVar32 = (long *)(pBVar5 + uVar39);
            if ((int)*plVar32 == (int)*plVar45) {
LAB_00183d77:
              plVar46 = (long *)((long)plVar45 + 1);
              sVar20 = ZSTD_hash8Ptr(plVar46,h_00);
              sVar21 = ZSTD_hash8Ptr(plVar46,uVar3);
              uVar40 = pUVar10[sVar20];
              uVar42 = pUVar8[sVar21 >> 8];
              pUVar10[sVar20] = UVar43;
              if (uVar12 < uVar40) {
                plVar33 = (long *)(pBVar5 + uVar40);
                if (*plVar33 != *plVar46) goto LAB_00183ffd;
                sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),(BYTE *)iEnd);
                uVar26 = sVar20 + 8;
                uVar39 = (int)plVar46 - (int)plVar33;
                for (; ((plVar45 = plVar46, iStart < plVar33 && (src < plVar46)) &&
                       (*(BYTE *)((long)plVar46 + -1) == *(BYTE *)((long)plVar33 + -1)));
                    plVar46 = (long *)((long)plVar46 + -1)) {
                  plVar33 = (long *)((long)plVar33 + -1);
                  uVar26 = uVar26 + 1;
                }
              }
              else {
                if ((char)sVar21 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar33 = (long *)(pBVar7 + uVar42);
                  if (mEnd <= plVar33) goto LAB_00185cd2;
                  if ((uVar4 < uVar42) && (*plVar33 == *plVar46)) {
                    sVar20 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar26 = sVar20 + 8;
                    uVar39 = UVar43 - (uVar42 + uVar30);
                    for (; ((plVar45 = plVar46, plVar25 < plVar33 && (src < plVar46)) &&
                           (*(BYTE *)((long)plVar46 + -1) == *(BYTE *)((long)plVar33 + -1)));
                        plVar46 = (long *)((long)plVar46 + -1)) {
                      plVar33 = (long *)((long)plVar33 + -1);
                      uVar26 = uVar26 + 1;
                    }
                    goto LAB_001841d6;
                  }
                }
LAB_00183ffd:
                if (uVar39 < uVar12) {
                  sVar20 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar26 = sVar20 + 4;
                  uVar39 = UVar41 - uVar39;
                  for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
                else {
                  sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd);
                  uVar26 = sVar20 + 4;
                  uVar39 = iVar44 - (int)plVar32;
                  for (; ((iStart < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
              }
LAB_001841d6:
              if (uVar39 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar27 = (long)plVar45 - (long)src;
                    plVar32 = (long *)seqStore->lit;
                    if ((BYTE *)((long)plVar32 + uVar27) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (plVar45 <= iEnd) {
                        if (plVar17 < plVar45) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_00184253:
                          seqStore->lit = seqStore->lit + uVar27;
                          if (0xffff < uVar27) {
                            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185c94;
                            seqStore->longLengthType = ZSTD_llt_literalLength;
                            seqStore->longLengthPos =
                                 (U32)((ulong)((long)seqStore->sequences -
                                              (long)seqStore->sequencesStart) >> 3);
                          }
                        }
                        else {
                          lVar28 = *(long *)((long)src + 8);
                          *plVar32 = *src;
                          plVar32[1] = lVar28;
                          pBVar37 = seqStore->lit;
                          if (0x10 < uVar27) {
                            if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                                0xffffffffffffffe1) {
                              lVar28 = *(long *)((long)src + 0x18);
                              *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                              *(long *)(pBVar37 + 0x18) = lVar28;
                              if (0x20 < (long)uVar27) {
                                lVar28 = 0;
                                do {
                                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                                  uVar13 = puVar2[1];
                                  pBVar1 = pBVar37 + lVar28 + 0x20;
                                  *(undefined8 *)pBVar1 = *puVar2;
                                  *(undefined8 *)(pBVar1 + 8) = uVar13;
                                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                                  uVar13 = puVar2[1];
                                  *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                                  *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                                  lVar28 = lVar28 + 0x20;
                                } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                              }
                              goto LAB_00184253;
                            }
                            goto LAB_00185cb3;
                          }
                          seqStore->lit = pBVar37 + uVar27;
                        }
                        psVar22 = seqStore->sequences;
                        psVar22->litLength = (U16)uVar27;
                        psVar22->offBase = uVar39 + 3;
                        if (2 < uVar26) {
                          uVar27 = uVar26 - 3;
                          uVar15 = local_124;
                          if (uVar27 < 0x10000) goto LAB_00184364;
                          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0018433f;
                          goto LAB_00185bf9;
                        }
                        goto LAB_00185b5e;
                      }
                      goto LAB_00185b9c;
                    }
                    goto LAB_00185b7d;
                  }
                  goto LAB_00185bbb;
                }
                goto LAB_00185b3f;
              }
              goto LAB_00185c18;
            }
          }
          else if ((char)uVar27 == (char)uVar42) {
            uVar42 = uVar42 >> 8;
            if ((uVar4 < uVar42) && (*(int *)(pBVar7 + uVar42) == (int)*plVar45)) {
              uVar39 = uVar42 + uVar30;
              plVar32 = (long *)(pBVar7 + uVar42);
              goto LAB_00183d77;
            }
          }
          plVar45 = (long *)((long)plVar45 + ((long)plVar45 - (long)src >> 8) + 1);
        }
        else {
          piVar36 = (int *)(pBVar5 + uVar38);
          if (uVar38 < uVar12) {
            piVar36 = (int *)(pBVar7 + (uVar38 - uVar30));
          }
          if (*piVar36 != *(int *)((long)plVar45 + 1)) goto LAB_00183cbd;
          plVar32 = iEnd;
          if (uVar38 < uVar12) {
            plVar32 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar45 + 5),(BYTE *)(piVar36 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar32,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00185b3f;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
          plVar45 = (long *)((long)plVar45 + 1);
          uVar27 = (long)plVar45 - (long)src;
          plVar32 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27))
          goto LAB_00185b7d;
          if (iEnd < plVar45) goto LAB_00185b9c;
          if (plVar17 < plVar45) {
            ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_00183f1e:
            seqStore->lit = seqStore->lit + uVar27;
            if (0xffff < uVar27) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185c94;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar28 = *(long *)((long)src + 8);
            *plVar32 = *src;
            plVar32[1] = lVar28;
            pBVar37 = seqStore->lit;
            if (0x10 < uVar27) {
              if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                lVar28 = *(long *)((long)src + 0x18);
                *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar37 + 0x18) = lVar28;
                if (0x20 < (long)uVar27) {
                  lVar28 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar1 = pBVar37 + lVar28 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                    lVar28 = lVar28 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                }
                goto LAB_00183f1e;
              }
              goto LAB_00185cb3;
            }
            seqStore->lit = pBVar37 + uVar27;
          }
          uVar26 = sVar20 + 4;
          psVar22 = seqStore->sequences;
          psVar22->litLength = (U16)uVar27;
          psVar22->offBase = 1;
          if (uVar26 < 3) goto LAB_00185b5e;
          uVar27 = sVar20 + 1;
          uVar39 = local_124;
          if (0xffff < uVar27) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185bf9;
LAB_0018433f:
            local_124 = uVar39;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
            uVar39 = local_124;
          }
LAB_00184364:
          local_124 = uVar39;
          plVar45 = (long *)(uVar26 + (long)plVar45);
          psVar22->mlBase = (U16)uVar27;
          seqStore->sequences = psVar22 + 1;
          src = plVar45;
          if (plVar45 <= plVar16) {
            uVar40 = UVar41 + 2;
            sVar20 = ZSTD_hash8Ptr(pBVar5 + uVar40,h_00);
            pUVar10[sVar20] = uVar40;
            sVar20 = ZSTD_hash8Ptr((void *)((long)plVar45 + -2),h_00);
            pUVar10[sVar20] = (int)(void *)((long)plVar45 + -2) - iVar29;
            pUVar11[(ulong)(*(long *)(pBVar5 + uVar40) * -0x30e4432345000000) >> (bVar24 & 0x3f)] =
                 uVar40;
            pUVar11[(ulong)(*(long *)((long)plVar45 + -1) * -0x30e4432345000000) >> (bVar24 & 0x3f)]
                 = ((int)plVar45 + -1) - iVar29;
            uVar40 = uVar15;
            for (; uVar15 = uVar40, src = plVar45, plVar45 <= plVar16;
                plVar45 = (long *)((long)plVar45 + sVar20 + 4)) {
              UVar41 = (int)plVar45 - iVar29;
              uVar40 = UVar41 - uVar15;
              pBVar37 = pBVar5;
              if (uVar40 < uVar12) {
                pBVar37 = pBVar7 + -uVar31;
              }
              if (((uVar12 - 1) - uVar40 < 3) || (*(int *)(pBVar37 + uVar40) != (int)*plVar45))
              break;
              plVar32 = iEnd;
              if (uVar40 < uVar12) {
                plVar32 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)(pBVar37 + uVar40) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar32,(BYTE *)iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_00185b3f;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
              plVar32 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00185b7d;
              if (iEnd < plVar45) goto LAB_00185b9c;
              if (plVar17 < plVar45) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar32,(BYTE *)plVar45,(BYTE *)plVar45,(BYTE *)plVar17);
              }
              else {
                lVar28 = plVar45[1];
                *plVar32 = *plVar45;
                plVar32[1] = lVar28;
              }
              psVar22 = seqStore->sequences;
              psVar22->litLength = 0;
              psVar22->offBase = 1;
              if (sVar20 + 4 < 3) goto LAB_00185b5e;
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185bf9;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar22->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar22 + 1;
              pUVar11[(ulong)(*plVar45 * -0x30e4432345000000) >> (bVar24 & 0x3f)] = UVar41;
              sVar21 = ZSTD_hash8Ptr(plVar45,h_00);
              pUVar10[sVar21] = UVar41;
              uVar40 = local_124;
              local_124 = uVar15;
            }
          }
        }
        goto LAB_00183b83;
      }
      goto LAB_00185af1;
    }
  }
  else if (uVar38 == 6) {
    if (uVar42 < uVar40) goto LAB_00185c37;
    if (ms->prefetchCDictTables != 0) {
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar24 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar23 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
    }
    if (uVar34 < local_124) goto LAB_00185c56;
    if (uVar15 <= uVar34) {
      plVar45 = (long *)((long)src + (ulong)(uVar34 == 0));
      plVar17 = iEnd + -4;
LAB_001830db:
      if (plVar45 < plVar16) {
        if (((0x20 < h_00) || (sVar20 = ZSTD_hash8Ptr(plVar45,h_00), 0x20 < h_01)) ||
           ((sVar21 = ZSTD_hash6Ptr(plVar45,h_01), 0x20 < uVar3 ||
            (sVar18 = ZSTD_hash8Ptr(plVar45,uVar3), 0x20 < h)))) {
LAB_00185b20:
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        sVar19 = ZSTD_hash6Ptr(plVar45,h);
        uVar40 = pUVar8[sVar18 >> 8];
        uVar42 = pUVar9[sVar19 >> 8];
        iVar44 = (int)plVar45;
        UVar41 = iVar44 - iVar29;
        uVar35 = pUVar10[sVar20];
        uVar39 = pUVar11[sVar21];
        UVar43 = UVar41 + 1;
        pUVar11[sVar21] = UVar41;
        uVar38 = UVar43 - local_124;
        pUVar10[sVar20] = UVar41;
        if ((uVar12 - 1) - uVar38 < 3) {
LAB_001831e0:
          if (uVar12 < uVar35) {
            plVar32 = (long *)(pBVar5 + uVar35);
            if (*plVar32 != *plVar45) goto LAB_0018323d;
            sVar20 = ZSTD_count((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd);
            uVar26 = sVar20 + 8;
            uVar39 = iVar44 - (int)plVar32;
            for (; ((iStart < plVar32 && (src < plVar45)) &&
                   (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                plVar45 = (long *)((long)plVar45 + -1)) {
              plVar32 = (long *)((long)plVar32 + -1);
              uVar26 = uVar26 + 1;
            }
            goto LAB_00183755;
          }
          if ((char)sVar18 == (char)uVar40) {
            uVar40 = uVar40 >> 8;
            plVar32 = (long *)(pBVar7 + uVar40);
            if (mEnd <= plVar32) {
LAB_00185bda:
              __assert_fail("dictMatchL < dictEnd",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x6e52,
                            "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            if ((uVar4 < uVar40) && (*plVar32 == *plVar45)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar26 = sVar20 + 8;
              uVar39 = UVar41 - (uVar40 + uVar30);
              for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                     (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                  plVar45 = (long *)((long)plVar45 + -1)) {
                plVar32 = (long *)((long)plVar32 + -1);
                uVar26 = uVar26 + 1;
              }
              goto LAB_00183755;
            }
          }
LAB_0018323d:
          if (uVar12 < uVar39) {
            plVar32 = (long *)(pBVar5 + uVar39);
            if ((int)*plVar32 == (int)*plVar45) {
LAB_00183512:
              plVar46 = (long *)((long)plVar45 + 1);
              sVar20 = ZSTD_hash8Ptr(plVar46,h_00);
              sVar21 = ZSTD_hash8Ptr(plVar46,uVar3);
              uVar40 = pUVar10[sVar20];
              uVar42 = pUVar8[sVar21 >> 8];
              pUVar10[sVar20] = UVar43;
              if (uVar12 < uVar40) {
                plVar33 = (long *)(pBVar5 + uVar40);
                if (*plVar33 != *plVar46) goto LAB_0018368a;
                sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),(BYTE *)iEnd);
                uVar26 = sVar20 + 8;
                uVar39 = (int)plVar46 - (int)plVar33;
                for (plVar45 = plVar46;
                    ((iStart < plVar33 && (src < plVar45)) &&
                    (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar33 + -1)));
                    plVar45 = (long *)((long)plVar45 + -1)) {
                  plVar33 = (long *)((long)plVar33 + -1);
                  uVar26 = uVar26 + 1;
                }
              }
              else {
                if ((char)sVar21 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar33 = (long *)(pBVar7 + uVar42);
                  if (mEnd <= plVar33) {
LAB_00185cd2:
                    __assert_fail("dictMatchL3 < dictEnd",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x6e86,
                                  "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                                 );
                  }
                  if ((uVar4 < uVar42) && (*plVar33 == *plVar46)) {
                    sVar20 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar26 = sVar20 + 8;
                    uVar39 = UVar43 - (uVar42 + uVar30);
                    for (plVar45 = plVar46;
                        ((plVar25 < plVar33 && (src < plVar45)) &&
                        (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar33 + -1)));
                        plVar45 = (long *)((long)plVar45 + -1)) {
                      plVar33 = (long *)((long)plVar33 + -1);
                      uVar26 = uVar26 + 1;
                    }
                    goto LAB_00183755;
                  }
                }
LAB_0018368a:
                if (uVar39 < uVar12) {
                  sVar20 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar26 = sVar20 + 4;
                  uVar39 = UVar41 - uVar39;
                  for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
                else {
                  sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd);
                  uVar26 = sVar20 + 4;
                  uVar39 = iVar44 - (int)plVar32;
                  for (; ((iStart < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
              }
LAB_00183755:
              if (uVar39 == 0) {
LAB_00185c18:
                __assert_fail("(offset)>0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x6e9e,
                              "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                             );
              }
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  uVar27 = (long)plVar45 - (long)src;
                  plVar32 = (long *)seqStore->lit;
                  if ((BYTE *)((long)plVar32 + uVar27) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (plVar45 <= iEnd) {
                      if (plVar17 < plVar45) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_001837cd:
                        seqStore->lit = seqStore->lit + uVar27;
                        if (0xffff < uVar27) {
                          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00185c94:
                            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                          ,0x46a0,
                                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                         );
                          }
                          seqStore->longLengthType = ZSTD_llt_literalLength;
                          seqStore->longLengthPos =
                               (U32)((ulong)((long)seqStore->sequences -
                                            (long)seqStore->sequencesStart) >> 3);
                        }
                      }
                      else {
                        lVar28 = *(long *)((long)src + 8);
                        *plVar32 = *src;
                        plVar32[1] = lVar28;
                        pBVar37 = seqStore->lit;
                        if (0x10 < uVar27) {
                          if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                              0xffffffffffffffe1) {
                            lVar28 = *(long *)((long)src + 0x18);
                            *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                            *(long *)(pBVar37 + 0x18) = lVar28;
                            if (0x20 < (long)uVar27) {
                              lVar28 = 0;
                              do {
                                puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                                uVar13 = puVar2[1];
                                pBVar1 = pBVar37 + lVar28 + 0x20;
                                *(undefined8 *)pBVar1 = *puVar2;
                                *(undefined8 *)(pBVar1 + 8) = uVar13;
                                puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                                uVar13 = puVar2[1];
                                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                                *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                                lVar28 = lVar28 + 0x20;
                              } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                            }
                            goto LAB_001837cd;
                          }
LAB_00185cb3:
                          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                        ,0x36a6,
                                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                       );
                        }
                        seqStore->lit = pBVar37 + uVar27;
                      }
                      psVar22 = seqStore->sequences;
                      psVar22->litLength = (U16)uVar27;
                      psVar22->offBase = uVar39 + 3;
                      if (2 < uVar26) {
                        uVar27 = uVar26 - 3;
                        uVar15 = local_124;
                        if (uVar27 < 0x10000) goto LAB_001838db;
                        if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001838b6;
                        goto LAB_00185bf9;
                      }
LAB_00185b5e:
                      __assert_fail("matchLength >= MINMATCH",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                    ,0x46aa,
                                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                   );
                    }
LAB_00185b9c:
                    __assert_fail("literals + litLength <= litLimit",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x468f,
                                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                 );
                  }
LAB_00185b7d:
                  __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x468e,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
LAB_00185bbb:
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x468d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
LAB_00185b3f:
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x468b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
          }
          else if ((char)sVar19 == (char)uVar42) {
            uVar42 = uVar42 >> 8;
            if ((uVar4 < uVar42) && (*(int *)(pBVar7 + uVar42) == (int)*plVar45)) {
              uVar39 = uVar42 + uVar30;
              plVar32 = (long *)(pBVar7 + uVar42);
              goto LAB_00183512;
            }
          }
          plVar45 = (long *)((long)plVar45 + ((long)plVar45 - (long)src >> 8) + 1);
        }
        else {
          piVar36 = (int *)(pBVar5 + uVar38);
          if (uVar38 < uVar12) {
            piVar36 = (int *)(pBVar7 + (uVar38 - uVar30));
          }
          if (*piVar36 != *(int *)((long)plVar45 + 1)) goto LAB_001831e0;
          plVar32 = iEnd;
          if (uVar38 < uVar12) {
            plVar32 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar45 + 5),(BYTE *)(piVar36 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar32,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00185b3f;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
          plVar45 = (long *)((long)plVar45 + 1);
          uVar27 = (long)plVar45 - (long)src;
          plVar32 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27))
          goto LAB_00185b7d;
          if (iEnd < plVar45) goto LAB_00185b9c;
          if (plVar17 < plVar45) {
            ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_00183338:
            seqStore->lit = seqStore->lit + uVar27;
            if (0xffff < uVar27) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185c94;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar28 = *(long *)((long)src + 8);
            *plVar32 = *src;
            plVar32[1] = lVar28;
            pBVar37 = seqStore->lit;
            if (0x10 < uVar27) {
              if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                lVar28 = *(long *)((long)src + 0x18);
                *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar37 + 0x18) = lVar28;
                if (0x20 < (long)uVar27) {
                  lVar28 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar1 = pBVar37 + lVar28 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                    lVar28 = lVar28 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                }
                goto LAB_00183338;
              }
              goto LAB_00185cb3;
            }
            seqStore->lit = pBVar37 + uVar27;
          }
          uVar26 = sVar20 + 4;
          psVar22 = seqStore->sequences;
          psVar22->litLength = (U16)uVar27;
          psVar22->offBase = 1;
          if (uVar26 < 3) goto LAB_00185b5e;
          uVar27 = sVar20 + 1;
          uVar39 = local_124;
          if (0xffff < uVar27) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00185bf9:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46ad,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
LAB_001838b6:
            local_124 = uVar39;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
            uVar39 = local_124;
          }
LAB_001838db:
          local_124 = uVar39;
          plVar45 = (long *)(uVar26 + (long)plVar45);
          psVar22->mlBase = (U16)uVar27;
          seqStore->sequences = psVar22 + 1;
          src = plVar45;
          if (plVar45 <= plVar16) {
            uVar40 = UVar41 + 2;
            sVar20 = ZSTD_hash8Ptr(pBVar5 + uVar40,h_00);
            pUVar10[sVar20] = uVar40;
            sVar20 = ZSTD_hash8Ptr((void *)((long)plVar45 + -2),h_00);
            pUVar10[sVar20] = (int)(void *)((long)plVar45 + -2) - iVar29;
            sVar20 = ZSTD_hash6Ptr(pBVar5 + uVar40,h_01);
            pUVar11[sVar20] = uVar40;
            sVar20 = ZSTD_hash6Ptr((void *)((long)plVar45 + -1),h_01);
            pUVar11[sVar20] = (int)(void *)((long)plVar45 + -1) - iVar29;
            uVar40 = uVar15;
            for (; uVar15 = uVar40, src = plVar45, plVar45 <= plVar16;
                plVar45 = (long *)((long)plVar45 + sVar20 + 4)) {
              UVar41 = (int)plVar45 - iVar29;
              uVar40 = UVar41 - uVar15;
              pBVar37 = pBVar5;
              if (uVar40 < uVar12) {
                pBVar37 = pBVar7 + -uVar31;
              }
              if (((uVar12 - 1) - uVar40 < 3) || (*(int *)(pBVar37 + uVar40) != (int)*plVar45))
              break;
              plVar32 = iEnd;
              if (uVar40 < uVar12) {
                plVar32 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)(pBVar37 + uVar40) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar32,(BYTE *)iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_00185b3f;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
              plVar32 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00185b7d;
              if (iEnd < plVar45) goto LAB_00185b9c;
              if (plVar17 < plVar45) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar32,(BYTE *)plVar45,(BYTE *)plVar45,(BYTE *)plVar17);
              }
              else {
                lVar28 = plVar45[1];
                *plVar32 = *plVar45;
                plVar32[1] = lVar28;
              }
              psVar22 = seqStore->sequences;
              psVar22->litLength = 0;
              psVar22->offBase = 1;
              if (sVar20 + 4 < 3) goto LAB_00185b5e;
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185bf9;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar22->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar22 + 1;
              sVar21 = ZSTD_hash6Ptr(plVar45,h_01);
              pUVar11[sVar21] = UVar41;
              sVar21 = ZSTD_hash8Ptr(plVar45,h_00);
              pUVar10[sVar21] = UVar41;
              uVar40 = local_124;
              local_124 = uVar15;
            }
          }
        }
        goto LAB_001830db;
      }
      goto LAB_00185af1;
    }
  }
  else if (uVar38 == 7) {
    if (uVar42 < uVar40) {
LAB_00185c37:
      __assert_fail("ms->window.dictLimit + (1U << cParams->windowLog) >= endIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6e14,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (ms->prefetchCDictTables != 0) {
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar24 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar23 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
    }
    if (uVar34 < local_124) {
LAB_00185c56:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6e22,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
    if (uVar15 <= uVar34) {
      plVar45 = (long *)((long)src + (ulong)(uVar34 == 0));
      bVar24 = 0x40 - cVar14;
      plVar17 = iEnd + -4;
LAB_0018463c:
      if (plVar45 < plVar16) {
        if (((0x20 < h_00) || (sVar20 = ZSTD_hash8Ptr(plVar45,h_00), 0x20 < h_01)) ||
           ((uVar26 = (ulong)(*plVar45 * -0x30e44323405a9d00) >> (bVar24 & 0x3f), 0x20 < uVar3 ||
            (sVar21 = ZSTD_hash8Ptr(plVar45,uVar3), 0x20 < h)))) goto LAB_00185b20;
        lVar28 = *plVar45;
        uVar27 = (ulong)(lVar28 * -0x30e44323405a9d00) >> (0x38 - bVar23 & 0x3f);
        uVar40 = pUVar8[sVar21 >> 8];
        uVar42 = pUVar9[uVar27 >> 8];
        iVar44 = (int)plVar45;
        UVar41 = iVar44 - iVar29;
        uVar35 = pUVar10[sVar20];
        uVar39 = pUVar11[uVar26];
        UVar43 = UVar41 + 1;
        pUVar11[uVar26] = UVar41;
        uVar38 = UVar43 - local_124;
        pUVar10[sVar20] = UVar41;
        if ((uVar12 - 1) - uVar38 < 3) {
LAB_00184766:
          if (uVar12 < uVar35) {
            plVar32 = (long *)(pBVar5 + uVar35);
            if (*plVar32 != lVar28) goto LAB_0018480a;
            sVar20 = ZSTD_count((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd);
            uVar26 = sVar20 + 8;
            uVar39 = iVar44 - (int)plVar32;
            for (; ((iStart < plVar32 && (src < plVar45)) &&
                   (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                plVar45 = (long *)((long)plVar45 + -1)) {
              plVar32 = (long *)((long)plVar32 + -1);
              uVar26 = uVar26 + 1;
            }
            goto LAB_00184c91;
          }
          if ((char)sVar21 == (char)uVar40) {
            uVar40 = uVar40 >> 8;
            plVar32 = (long *)(pBVar7 + uVar40);
            if (mEnd <= plVar32) goto LAB_00185bda;
            if ((uVar4 < uVar40) && (*plVar32 == lVar28)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar26 = sVar20 + 8;
              uVar39 = UVar41 - (uVar40 + uVar30);
              for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                     (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                  plVar45 = (long *)((long)plVar45 + -1)) {
                plVar32 = (long *)((long)plVar32 + -1);
                uVar26 = uVar26 + 1;
              }
              goto LAB_00184c91;
            }
          }
LAB_0018480a:
          if (uVar12 < uVar39) {
            plVar32 = (long *)(pBVar5 + uVar39);
            if ((int)*plVar32 == (int)*plVar45) {
LAB_00184824:
              plVar46 = (long *)((long)plVar45 + 1);
              sVar20 = ZSTD_hash8Ptr(plVar46,h_00);
              sVar21 = ZSTD_hash8Ptr(plVar46,uVar3);
              uVar40 = pUVar10[sVar20];
              uVar42 = pUVar8[sVar21 >> 8];
              pUVar10[sVar20] = UVar43;
              if (uVar12 < uVar40) {
                plVar33 = (long *)(pBVar5 + uVar40);
                if (*plVar33 != *plVar46) goto LAB_00184ab5;
                sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),(BYTE *)iEnd);
                uVar26 = sVar20 + 8;
                uVar39 = (int)plVar46 - (int)plVar33;
                for (; ((plVar45 = plVar46, iStart < plVar33 && (src < plVar46)) &&
                       (*(BYTE *)((long)plVar46 + -1) == *(BYTE *)((long)plVar33 + -1)));
                    plVar46 = (long *)((long)plVar46 + -1)) {
                  plVar33 = (long *)((long)plVar33 + -1);
                  uVar26 = uVar26 + 1;
                }
              }
              else {
                if ((char)sVar21 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar33 = (long *)(pBVar7 + uVar42);
                  if (mEnd <= plVar33) goto LAB_00185cd2;
                  if ((uVar4 < uVar42) && (*plVar33 == *plVar46)) {
                    sVar20 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar26 = sVar20 + 8;
                    uVar39 = UVar43 - (uVar42 + uVar30);
                    for (; ((plVar45 = plVar46, plVar25 < plVar33 && (src < plVar46)) &&
                           (*(BYTE *)((long)plVar46 + -1) == *(BYTE *)((long)plVar33 + -1)));
                        plVar46 = (long *)((long)plVar46 + -1)) {
                      plVar33 = (long *)((long)plVar33 + -1);
                      uVar26 = uVar26 + 1;
                    }
                    goto LAB_00184c91;
                  }
                }
LAB_00184ab5:
                if (uVar39 < uVar12) {
                  sVar20 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar26 = sVar20 + 4;
                  uVar39 = UVar41 - uVar39;
                  for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
                else {
                  sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd);
                  uVar26 = sVar20 + 4;
                  uVar39 = iVar44 - (int)plVar32;
                  for (; ((iStart < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
              }
LAB_00184c91:
              if (uVar39 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar27 = (long)plVar45 - (long)src;
                    plVar32 = (long *)seqStore->lit;
                    if ((BYTE *)((long)plVar32 + uVar27) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (plVar45 <= iEnd) {
                        if (plVar17 < plVar45) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_00184d0e:
                          seqStore->lit = seqStore->lit + uVar27;
                          if (0xffff < uVar27) {
                            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185c94;
                            seqStore->longLengthType = ZSTD_llt_literalLength;
                            seqStore->longLengthPos =
                                 (U32)((ulong)((long)seqStore->sequences -
                                              (long)seqStore->sequencesStart) >> 3);
                          }
                        }
                        else {
                          lVar28 = *(long *)((long)src + 8);
                          *plVar32 = *src;
                          plVar32[1] = lVar28;
                          pBVar37 = seqStore->lit;
                          if (0x10 < uVar27) {
                            if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                                0xffffffffffffffe1) {
                              lVar28 = *(long *)((long)src + 0x18);
                              *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                              *(long *)(pBVar37 + 0x18) = lVar28;
                              if (0x20 < (long)uVar27) {
                                lVar28 = 0;
                                do {
                                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                                  uVar13 = puVar2[1];
                                  pBVar1 = pBVar37 + lVar28 + 0x20;
                                  *(undefined8 *)pBVar1 = *puVar2;
                                  *(undefined8 *)(pBVar1 + 8) = uVar13;
                                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                                  uVar13 = puVar2[1];
                                  *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                                  *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                                  lVar28 = lVar28 + 0x20;
                                } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                              }
                              goto LAB_00184d0e;
                            }
                            goto LAB_00185cb3;
                          }
                          seqStore->lit = pBVar37 + uVar27;
                        }
                        psVar22 = seqStore->sequences;
                        psVar22->litLength = (U16)uVar27;
                        psVar22->offBase = uVar39 + 3;
                        if (2 < uVar26) {
                          uVar27 = uVar26 - 3;
                          uVar15 = local_124;
                          if (uVar27 < 0x10000) goto LAB_00184e1f;
                          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_00184dfa;
                          goto LAB_00185bf9;
                        }
                        goto LAB_00185b5e;
                      }
                      goto LAB_00185b9c;
                    }
                    goto LAB_00185b7d;
                  }
                  goto LAB_00185bbb;
                }
                goto LAB_00185b3f;
              }
              goto LAB_00185c18;
            }
          }
          else if ((char)uVar27 == (char)uVar42) {
            uVar42 = uVar42 >> 8;
            if ((uVar4 < uVar42) && (*(int *)(pBVar7 + uVar42) == (int)*plVar45)) {
              uVar39 = uVar42 + uVar30;
              plVar32 = (long *)(pBVar7 + uVar42);
              goto LAB_00184824;
            }
          }
          plVar45 = (long *)((long)plVar45 + ((long)plVar45 - (long)src >> 8) + 1);
        }
        else {
          piVar36 = (int *)(pBVar5 + uVar38);
          if (uVar38 < uVar12) {
            piVar36 = (int *)(pBVar7 + (uVar38 - uVar30));
          }
          if (*piVar36 != *(int *)((long)plVar45 + 1)) goto LAB_00184766;
          plVar32 = iEnd;
          if (uVar38 < uVar12) {
            plVar32 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar45 + 5),(BYTE *)(piVar36 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar32,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00185b3f;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
          plVar45 = (long *)((long)plVar45 + 1);
          uVar27 = (long)plVar45 - (long)src;
          plVar32 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27))
          goto LAB_00185b7d;
          if (iEnd < plVar45) goto LAB_00185b9c;
          if (plVar17 < plVar45) {
            ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_001849ce:
            seqStore->lit = seqStore->lit + uVar27;
            if (0xffff < uVar27) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185c94;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar28 = *(long *)((long)src + 8);
            *plVar32 = *src;
            plVar32[1] = lVar28;
            pBVar37 = seqStore->lit;
            if (0x10 < uVar27) {
              if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                lVar28 = *(long *)((long)src + 0x18);
                *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar37 + 0x18) = lVar28;
                if (0x20 < (long)uVar27) {
                  lVar28 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar1 = pBVar37 + lVar28 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                    lVar28 = lVar28 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                }
                goto LAB_001849ce;
              }
              goto LAB_00185cb3;
            }
            seqStore->lit = pBVar37 + uVar27;
          }
          uVar26 = sVar20 + 4;
          psVar22 = seqStore->sequences;
          psVar22->litLength = (U16)uVar27;
          psVar22->offBase = 1;
          if (uVar26 < 3) goto LAB_00185b5e;
          uVar27 = sVar20 + 1;
          uVar39 = local_124;
          if (0xffff < uVar27) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185bf9;
LAB_00184dfa:
            local_124 = uVar39;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
            uVar39 = local_124;
          }
LAB_00184e1f:
          local_124 = uVar39;
          plVar45 = (long *)(uVar26 + (long)plVar45);
          psVar22->mlBase = (U16)uVar27;
          seqStore->sequences = psVar22 + 1;
          src = plVar45;
          if (plVar45 <= plVar16) {
            uVar40 = UVar41 + 2;
            sVar20 = ZSTD_hash8Ptr(pBVar5 + uVar40,h_00);
            pUVar10[sVar20] = uVar40;
            sVar20 = ZSTD_hash8Ptr((void *)((long)plVar45 + -2),h_00);
            pUVar10[sVar20] = (int)(void *)((long)plVar45 + -2) - iVar29;
            pUVar11[(ulong)(*(long *)(pBVar5 + uVar40) * -0x30e44323405a9d00) >> (bVar24 & 0x3f)] =
                 uVar40;
            pUVar11[(ulong)(*(long *)((long)plVar45 + -1) * -0x30e44323405a9d00) >> (bVar24 & 0x3f)]
                 = ((int)plVar45 + -1) - iVar29;
            uVar40 = uVar15;
            for (; uVar15 = uVar40, src = plVar45, plVar45 <= plVar16;
                plVar45 = (long *)((long)plVar45 + sVar20 + 4)) {
              UVar41 = (int)plVar45 - iVar29;
              uVar40 = UVar41 - uVar15;
              pBVar37 = pBVar5;
              if (uVar40 < uVar12) {
                pBVar37 = pBVar7 + -uVar31;
              }
              if (((uVar12 - 1) - uVar40 < 3) || (*(int *)(pBVar37 + uVar40) != (int)*plVar45))
              break;
              plVar32 = iEnd;
              if (uVar40 < uVar12) {
                plVar32 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)(pBVar37 + uVar40) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar32,(BYTE *)iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_00185b3f;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
              plVar32 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00185b7d;
              if (iEnd < plVar45) goto LAB_00185b9c;
              if (plVar17 < plVar45) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar32,(BYTE *)plVar45,(BYTE *)plVar45,(BYTE *)plVar17);
              }
              else {
                lVar28 = plVar45[1];
                *plVar32 = *plVar45;
                plVar32[1] = lVar28;
              }
              psVar22 = seqStore->sequences;
              psVar22->litLength = 0;
              psVar22->offBase = 1;
              if (sVar20 + 4 < 3) goto LAB_00185b5e;
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185bf9;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar22->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar22 + 1;
              pUVar11[(ulong)(*plVar45 * -0x30e44323405a9d00) >> (bVar24 & 0x3f)] = UVar41;
              sVar21 = ZSTD_hash8Ptr(plVar45,h_00);
              pUVar10[sVar21] = UVar41;
              uVar40 = local_124;
              local_124 = uVar15;
            }
          }
        }
        goto LAB_0018463c;
      }
LAB_00185af1:
      *rep = local_124;
      rep[1] = uVar15;
      return (long)iEnd - (long)src;
    }
  }
  else {
    if (uVar42 < uVar40) goto LAB_00185c37;
    if (ms->prefetchCDictTables != 0) {
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar24 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
      for (uVar26 = 0; uVar26 < (ulong)(4L << (bVar23 & 0x3f)); uVar26 = uVar26 + 0x40) {
      }
    }
    if (uVar34 < local_124) goto LAB_00185c56;
    if (uVar15 <= uVar34) {
      plVar45 = (long *)((long)src + (ulong)(uVar34 == 0));
      bVar24 = 0x20 - cVar14;
      plVar17 = iEnd + -4;
LAB_001850db:
      if (plVar45 < plVar16) {
        if (((0x20 < h_00) || (sVar20 = ZSTD_hash8Ptr(plVar45,h_00), 0x20 < h_01)) ||
           ((uVar40 = (uint)((int)*plVar45 * -0x61c8864f) >> (bVar24 & 0x1f), 0x20 < uVar3 ||
            (sVar21 = ZSTD_hash8Ptr(plVar45,uVar3), 0x20 < h)))) goto LAB_00185b20;
        uVar34 = (uint)((int)*plVar45 * -0x61c8864f) >> (0x18 - bVar23 & 0x1f);
        uVar42 = pUVar8[sVar21 >> 8];
        uVar35 = pUVar9[uVar34 >> 8];
        iVar44 = (int)plVar45;
        UVar43 = iVar44 - iVar29;
        uVar39 = pUVar10[sVar20];
        uVar38 = pUVar11[uVar40];
        UVar41 = UVar43 + 1;
        pUVar11[uVar40] = UVar43;
        uVar40 = UVar41 - local_124;
        pUVar10[sVar20] = UVar43;
        if ((uVar12 - 1) - uVar40 < 3) {
LAB_001851eb:
          if (uVar12 < uVar39) {
            plVar32 = (long *)(pBVar5 + uVar39);
            if (*plVar32 != *plVar45) goto LAB_00185294;
            sVar20 = ZSTD_count((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd);
            uVar26 = sVar20 + 8;
            uVar38 = iVar44 - (int)plVar32;
            for (; ((iStart < plVar32 && (src < plVar45)) &&
                   (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                plVar45 = (long *)((long)plVar45 + -1)) {
              plVar32 = (long *)((long)plVar32 + -1);
              uVar26 = uVar26 + 1;
            }
            goto LAB_00185735;
          }
          if ((char)sVar21 == (char)uVar42) {
            uVar42 = uVar42 >> 8;
            plVar32 = (long *)(pBVar7 + uVar42);
            if (mEnd <= plVar32) goto LAB_00185bda;
            if ((uVar4 < uVar42) && (*plVar32 == *plVar45)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)(plVar45 + 1),(BYTE *)(plVar32 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              uVar26 = sVar20 + 8;
              uVar38 = UVar43 - (uVar42 + uVar30);
              for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                     (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                  plVar45 = (long *)((long)plVar45 + -1)) {
                plVar32 = (long *)((long)plVar32 + -1);
                uVar26 = uVar26 + 1;
              }
              goto LAB_00185735;
            }
          }
LAB_00185294:
          if (uVar12 < uVar38) {
            plVar32 = (long *)(pBVar5 + uVar38);
            if ((int)*plVar32 == (int)*plVar45) {
LAB_001852ae:
              plVar46 = (long *)((long)plVar45 + 1);
              sVar20 = ZSTD_hash8Ptr(plVar46,h_00);
              sVar21 = ZSTD_hash8Ptr(plVar46,uVar3);
              uVar40 = pUVar10[sVar20];
              uVar42 = pUVar8[sVar21 >> 8];
              pUVar10[sVar20] = UVar41;
              if (uVar12 < uVar40) {
                plVar33 = (long *)(pBVar5 + uVar40);
                if (*plVar33 != *plVar46) goto LAB_0018554a;
                sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),(BYTE *)iEnd);
                uVar26 = sVar20 + 8;
                uVar38 = (int)plVar46 - (int)plVar33;
                for (; ((plVar45 = plVar46, iStart < plVar33 && (src < plVar46)) &&
                       (*(BYTE *)((long)plVar46 + -1) == *(BYTE *)((long)plVar33 + -1)));
                    plVar46 = (long *)((long)plVar46 + -1)) {
                  plVar33 = (long *)((long)plVar33 + -1);
                  uVar26 = uVar26 + 1;
                }
              }
              else {
                if ((char)sVar21 == (char)uVar42) {
                  uVar42 = uVar42 >> 8;
                  plVar33 = (long *)(pBVar7 + uVar42);
                  if (mEnd <= plVar33) goto LAB_00185cd2;
                  if ((uVar4 < uVar42) && (*plVar33 == *plVar46)) {
                    sVar20 = ZSTD_count_2segments
                                       ((BYTE *)((long)plVar45 + 9),(BYTE *)(plVar33 + 1),
                                        (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                    uVar26 = sVar20 + 8;
                    uVar38 = UVar41 - (uVar42 + uVar30);
                    for (; ((plVar45 = plVar46, plVar25 < plVar33 && (src < plVar46)) &&
                           (*(BYTE *)((long)plVar46 + -1) == *(BYTE *)((long)plVar33 + -1)));
                        plVar46 = (long *)((long)plVar46 + -1)) {
                      plVar33 = (long *)((long)plVar33 + -1);
                      uVar26 = uVar26 + 1;
                    }
                    goto LAB_00185735;
                  }
                }
LAB_0018554a:
                if (uVar38 < uVar12) {
                  sVar20 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  uVar26 = sVar20 + 4;
                  uVar38 = UVar43 - uVar38;
                  for (; ((plVar25 < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
                else {
                  sVar20 = ZSTD_count((BYTE *)((long)plVar45 + 4),(BYTE *)((long)plVar32 + 4),
                                      (BYTE *)iEnd);
                  uVar26 = sVar20 + 4;
                  uVar38 = iVar44 - (int)plVar32;
                  for (; ((iStart < plVar32 && (src < plVar45)) &&
                         (*(BYTE *)((long)plVar45 + -1) == *(BYTE *)((long)plVar32 + -1)));
                      plVar45 = (long *)((long)plVar45 + -1)) {
                    plVar32 = (long *)((long)plVar32 + -1);
                    uVar26 = uVar26 + 1;
                  }
                }
              }
LAB_00185735:
              if (uVar38 != 0) {
                if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                    seqStore->maxNbSeq) {
                  if (seqStore->maxNbLit < 0x20001) {
                    uVar27 = (long)plVar45 - (long)src;
                    plVar32 = (long *)seqStore->lit;
                    if ((BYTE *)((long)plVar32 + uVar27) <= seqStore->litStart + seqStore->maxNbLit)
                    {
                      if (plVar45 <= iEnd) {
                        if (plVar17 < plVar45) {
                          ZSTD_safecopyLiterals
                                    ((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_001857b8:
                          seqStore->lit = seqStore->lit + uVar27;
                          if (0xffff < uVar27) {
                            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185c94;
                            seqStore->longLengthType = ZSTD_llt_literalLength;
                            seqStore->longLengthPos =
                                 (U32)((ulong)((long)seqStore->sequences -
                                              (long)seqStore->sequencesStart) >> 3);
                          }
                        }
                        else {
                          lVar28 = *(long *)((long)src + 8);
                          *plVar32 = *src;
                          plVar32[1] = lVar28;
                          pBVar37 = seqStore->lit;
                          if (0x10 < uVar27) {
                            if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                                0xffffffffffffffe1) {
                              lVar28 = *(long *)((long)src + 0x18);
                              *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                              *(long *)(pBVar37 + 0x18) = lVar28;
                              if (0x20 < (long)uVar27) {
                                lVar28 = 0;
                                do {
                                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                                  uVar13 = puVar2[1];
                                  pBVar1 = pBVar37 + lVar28 + 0x20;
                                  *(undefined8 *)pBVar1 = *puVar2;
                                  *(undefined8 *)(pBVar1 + 8) = uVar13;
                                  puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                                  uVar13 = puVar2[1];
                                  *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                                  *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                                  lVar28 = lVar28 + 0x20;
                                } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                              }
                              goto LAB_001857b8;
                            }
                            goto LAB_00185cb3;
                          }
                          seqStore->lit = pBVar37 + uVar27;
                        }
                        psVar22 = seqStore->sequences;
                        psVar22->litLength = (U16)uVar27;
                        psVar22->offBase = uVar38 + 3;
                        if (2 < uVar26) {
                          uVar27 = uVar26 - 3;
                          uVar15 = local_124;
                          if (uVar27 < 0x10000) goto LAB_001858c9;
                          if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001858a4;
                          goto LAB_00185bf9;
                        }
                        goto LAB_00185b5e;
                      }
                      goto LAB_00185b9c;
                    }
                    goto LAB_00185b7d;
                  }
                  goto LAB_00185bbb;
                }
                goto LAB_00185b3f;
              }
              goto LAB_00185c18;
            }
          }
          else if ((char)uVar34 == (char)uVar35) {
            uVar35 = uVar35 >> 8;
            if ((uVar4 < uVar35) && (*(int *)(pBVar7 + uVar35) == (int)*plVar45)) {
              uVar38 = uVar35 + uVar30;
              plVar32 = (long *)(pBVar7 + uVar35);
              goto LAB_001852ae;
            }
          }
          plVar45 = (long *)((long)plVar45 + ((long)plVar45 - (long)src >> 8) + 1);
        }
        else {
          piVar36 = (int *)(pBVar5 + uVar40);
          if (uVar40 < uVar12) {
            piVar36 = (int *)(pBVar7 + (uVar40 - uVar30));
          }
          if (*piVar36 != *(int *)((long)plVar45 + 1)) goto LAB_001851eb;
          plVar32 = iEnd;
          if (uVar40 < uVar12) {
            plVar32 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar45 + 5),(BYTE *)(piVar36 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar32,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00185b3f;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
          plVar45 = (long *)((long)plVar45 + 1);
          uVar27 = (long)plVar45 - (long)src;
          plVar32 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar32 + uVar27))
          goto LAB_00185b7d;
          if (iEnd < plVar45) goto LAB_00185b9c;
          if (plVar17 < plVar45) {
            ZSTD_safecopyLiterals((BYTE *)plVar32,(BYTE *)src,(BYTE *)plVar45,(BYTE *)plVar17);
LAB_00185470:
            seqStore->lit = seqStore->lit + uVar27;
            if (0xffff < uVar27) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185c94;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar28 = *(long *)((long)src + 8);
            *plVar32 = *src;
            plVar32[1] = lVar28;
            pBVar37 = seqStore->lit;
            if (0x10 < uVar27) {
              if ((ulong)((long)(pBVar37 + 0x10) + (-0x10 - ((long)src + 0x10))) <
                  0xffffffffffffffe1) {
                lVar28 = *(long *)((long)src + 0x18);
                *(long *)(pBVar37 + 0x10) = *(long *)((long)src + 0x10);
                *(long *)(pBVar37 + 0x18) = lVar28;
                if (0x20 < (long)uVar27) {
                  lVar28 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x20);
                    uVar13 = puVar2[1];
                    pBVar1 = pBVar37 + lVar28 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar13;
                    puVar2 = (undefined8 *)((long)src + lVar28 + 0x30);
                    uVar13 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                    lVar28 = lVar28 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar37 + uVar27);
                }
                goto LAB_00185470;
              }
              goto LAB_00185cb3;
            }
            seqStore->lit = pBVar37 + uVar27;
          }
          uVar26 = sVar20 + 4;
          psVar22 = seqStore->sequences;
          psVar22->litLength = (U16)uVar27;
          psVar22->offBase = 1;
          if (uVar26 < 3) goto LAB_00185b5e;
          uVar27 = sVar20 + 1;
          uVar38 = local_124;
          if (0xffff < uVar27) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185bf9;
LAB_001858a4:
            local_124 = uVar38;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
            uVar38 = local_124;
          }
LAB_001858c9:
          local_124 = uVar38;
          plVar45 = (long *)(uVar26 + (long)plVar45);
          psVar22->mlBase = (U16)uVar27;
          seqStore->sequences = psVar22 + 1;
          src = plVar45;
          if (plVar45 <= plVar16) {
            uVar40 = UVar43 + 2;
            sVar20 = ZSTD_hash8Ptr(pBVar5 + uVar40,h_00);
            pUVar10[sVar20] = uVar40;
            sVar20 = ZSTD_hash8Ptr((void *)((long)plVar45 + -2),h_00);
            pUVar10[sVar20] = (int)(void *)((long)plVar45 + -2) - iVar29;
            pUVar11[(uint)(*(int *)(pBVar5 + uVar40) * -0x61c8864f) >> (bVar24 & 0x1f)] = uVar40;
            pUVar11[(uint)(*(int *)((long)plVar45 + -1) * -0x61c8864f) >> (bVar24 & 0x1f)] =
                 ((int)plVar45 + -1) - iVar29;
            uVar40 = uVar15;
            for (; uVar15 = uVar40, src = plVar45, plVar45 <= plVar16;
                plVar45 = (long *)((long)plVar45 + sVar20 + 4)) {
              UVar41 = (int)plVar45 - iVar29;
              uVar40 = UVar41 - uVar15;
              pBVar37 = pBVar5;
              if (uVar40 < uVar12) {
                pBVar37 = pBVar7 + -uVar31;
              }
              if (((uVar12 - 1) - uVar40 < 3) || (*(int *)(pBVar37 + uVar40) != (int)*plVar45))
              break;
              plVar32 = iEnd;
              if (uVar40 < uVar12) {
                plVar32 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar45 + 4),(BYTE *)((long)(pBVar37 + uVar40) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar32,(BYTE *)iStart);
              if (seqStore->maxNbSeq <=
                  (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
              goto LAB_00185b3f;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00185bbb;
              plVar32 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar32) goto LAB_00185b7d;
              if (iEnd < plVar45) goto LAB_00185b9c;
              if (plVar17 < plVar45) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar32,(BYTE *)plVar45,(BYTE *)plVar45,(BYTE *)plVar17);
              }
              else {
                lVar28 = plVar45[1];
                *plVar32 = *plVar45;
                plVar32[1] = lVar28;
              }
              psVar22 = seqStore->sequences;
              psVar22->litLength = 0;
              psVar22->offBase = 1;
              if (sVar20 + 4 < 3) goto LAB_00185b5e;
              if (0xffff < sVar20 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00185bf9;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar22 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar22->mlBase = (U16)(sVar20 + 1);
              seqStore->sequences = psVar22 + 1;
              pUVar11[(uint)((int)*plVar45 * -0x61c8864f) >> (bVar24 & 0x1f)] = UVar41;
              sVar21 = ZSTD_hash8Ptr(plVar45,h_00);
              pUVar10[sVar21] = UVar41;
              uVar40 = local_124;
              local_124 = uVar15;
            }
          }
        }
        goto LAB_001850db;
      }
      goto LAB_00185af1;
    }
  }
  __assert_fail("offset_2 <= dictAndPrefixLength",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x6e23,
                "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
               );
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}